

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mgm.c
# Opt level: O1

int test_block(EVP_CIPHER *ciph,char *name,uchar *nonce,size_t nlen,uchar *aad,size_t alen,
              uchar *ptext,size_t plen,uchar *exp_ctext,uchar *exp_tag,uchar *key,int small)

{
  long lVar1;
  long lVar2;
  size_t __n;
  EVP_CIPHER *pEVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  EVP_CIPHER_CTX *ctx;
  uchar *puVar7;
  uint uVar8;
  size_t sVar9;
  char *pcVar10;
  uchar *puVar11;
  uchar *puVar12;
  uchar auStack_a0 [16];
  char *local_90;
  size_t local_88;
  uchar *local_80;
  EVP_CIPHER *local_78;
  char *local_70;
  uchar *local_68;
  size_t local_60;
  uint local_54;
  uchar *local_50;
  size_t local_48;
  int local_3c;
  int local_38;
  int outlen1;
  int outlen2;
  int tmplen;
  
  builtin_memcpy(auStack_a0,"\x1d\x14\x10",4);
  auStack_a0[4] = '\0';
  auStack_a0[5] = '\0';
  auStack_a0[6] = '\0';
  auStack_a0[7] = '\0';
  local_80 = nonce;
  local_78 = (EVP_CIPHER *)ciph;
  local_70 = name;
  local_48 = alen;
  ctx = EVP_CIPHER_CTX_new();
  pcVar10 = local_70;
  lVar2 = 8 - (plen + 0xf & 0xfffffffffffffff0);
  puVar11 = auStack_a0 + lVar2;
  local_88 = (size_t)(int)nlen;
  lVar1 = -(local_88 + 0xf & 0xfffffffffffffff0);
  puVar7 = puVar11 + lVar1;
  local_68 = puVar7;
  if (ctx == (EVP_CIPHER_CTX *)0x0) {
    builtin_memcpy(auStack_a0 + lVar1 + lVar2 + -8,"\x03\x18\x10",4);
    puVar7[-4] = '\0';
    puVar7[-3] = '\0';
    puVar7[-2] = '\0';
    puVar7[-1] = '\0';
    OPENSSL_die("assertion failed: ctx",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_mgm.c"
                ,0xa3);
    halt_baddata();
  }
  local_90 = "small chunks";
  if (small == 0) {
    local_90 = "big chunks";
  }
  puVar7[-8] = 0x88;
  puVar7[-7] = '\x14';
  puVar7[-6] = '\x10';
  puVar7[-5] = '\0';
  puVar7[-4] = '\0';
  puVar7[-3] = '\0';
  puVar7[-2] = '\0';
  puVar7[-1] = '\0';
  printf("Encryption test %s [%s]: ",pcVar10);
  puVar7[-8] = 0x90;
  puVar7[-7] = '\x14';
  puVar7[-6] = '\x10';
  puVar7[-5] = '\0';
  puVar7[-4] = '\0';
  puVar7[-3] = '\0';
  puVar7[-2] = '\0';
  puVar7[-1] = '\0';
  EVP_CIPHER_CTX_reset(ctx);
  pEVar3 = local_78;
  puVar7[-8] = 0xa3;
  puVar7[-7] = '\x14';
  puVar7[-6] = '\x10';
  puVar7[-5] = '\0';
  puVar7[-4] = '\0';
  puVar7[-3] = '\0';
  puVar7[-2] = '\0';
  puVar7[-1] = '\0';
  EVP_EncryptInit_ex(ctx,pEVar3,(ENGINE *)0x0,(uchar *)0x0,(uchar *)0x0);
  local_60 = nlen;
  puVar7[-8] = 0xb9;
  puVar7[-7] = '\x14';
  puVar7[-6] = '\x10';
  puVar7[-5] = '\0';
  puVar7[-4] = '\0';
  puVar7[-3] = '\0';
  puVar7[-2] = '\0';
  puVar7[-1] = '\0';
  EVP_CIPHER_CTX_ctrl(ctx,9,(int)nlen,(void *)0x0);
  puVar12 = local_80;
  puVar7[-8] = 0xcd;
  puVar7[-7] = '\x14';
  puVar7[-6] = '\x10';
  puVar7[-5] = '\0';
  puVar7[-4] = '\0';
  puVar7[-3] = '\0';
  puVar7[-2] = '\0';
  puVar7[-1] = '\0';
  EVP_EncryptInit_ex(ctx,(EVP_CIPHER *)0x0,(ENGINE *)0x0,key,puVar12);
  puVar7[-8] = 0xde;
  puVar7[-7] = '\x14';
  puVar7[-6] = '\x10';
  puVar7[-5] = '\0';
  puVar7[-4] = '\0';
  puVar7[-3] = '\0';
  puVar7[-2] = '\0';
  puVar7[-1] = '\0';
  memset(puVar11,0,plen);
  sVar9 = local_48;
  local_50 = puVar11;
  if (small == 0) {
    builtin_memcpy(auStack_a0 + lVar1 + lVar2 + -8,"y\x15\x10",4);
    puVar7[-4] = '\0';
    puVar7[-3] = '\0';
    puVar7[-2] = '\0';
    puVar7[-1] = '\0';
    EVP_EncryptUpdate(ctx,(uchar *)0x0,&local_3c,aad,(int)sVar9);
    puVar7[-8] = 0x8f;
    puVar7[-7] = '\x15';
    puVar7[-6] = '\x10';
    puVar7[-5] = '\0';
    puVar7[-4] = '\0';
    puVar7[-3] = '\0';
    puVar7[-2] = '\0';
    puVar7[-1] = '\0';
    EVP_EncryptUpdate(ctx,puVar11,&local_38,ptext,(int)plen);
  }
  else {
    local_38 = 0;
    local_3c = 0;
    if (local_48 != 0) {
      puVar11 = aad;
      do {
        builtin_memcpy(auStack_a0 + lVar1 + lVar2 + -8,"\x17\x15\x10",4);
        puVar7[-4] = '\0';
        puVar7[-3] = '\0';
        puVar7[-2] = '\0';
        puVar7[-1] = '\0';
        EVP_EncryptUpdate(ctx,(uchar *)0x0,&outlen1,puVar11,1);
        local_3c = local_3c + outlen1;
        puVar11 = puVar11 + 1;
        sVar9 = sVar9 - 1;
      } while (sVar9 != 0);
    }
    puVar11 = ptext;
    sVar9 = plen;
    puVar12 = local_50;
    if (plen != 0) {
      do {
        builtin_memcpy(auStack_a0 + lVar1 + lVar2 + -8,"P\x15\x10",4);
        puVar7[-4] = '\0';
        puVar7[-3] = '\0';
        puVar7[-2] = '\0';
        puVar7[-1] = '\0';
        EVP_EncryptUpdate(ctx,puVar12,&outlen1,puVar11,1);
        local_38 = local_38 + outlen1;
        sVar9 = sVar9 - 1;
        puVar11 = puVar11 + 1;
        puVar12 = puVar12 + outlen1;
      } while (sVar9 != 0);
    }
  }
  puVar11 = local_50;
  puVar7[-8] = 0xa3;
  puVar7[-7] = '\x15';
  puVar7[-6] = '\x10';
  puVar7[-5] = '\0';
  puVar7[-4] = '\0';
  puVar7[-3] = '\0';
  puVar7[-2] = '\0';
  puVar7[-1] = '\0';
  EVP_EncryptFinal_ex(ctx,puVar11,&outlen1);
  sVar9 = local_60;
  puVar11 = local_68;
  puVar7[-8] = 0xb8;
  puVar7[-7] = '\x15';
  puVar7[-6] = '\x10';
  puVar7[-5] = '\0';
  puVar7[-4] = '\0';
  puVar7[-3] = '\0';
  puVar7[-2] = '\0';
  puVar7[-1] = '\0';
  EVP_CIPHER_CTX_ctrl(ctx,0x10,(int)sVar9,puVar11);
  puVar7[-8] = 0xc0;
  puVar7[-7] = '\x15';
  puVar7[-6] = '\x10';
  puVar7[-5] = '\0';
  puVar7[-4] = '\0';
  puVar7[-3] = '\0';
  puVar7[-2] = '\0';
  puVar7[-1] = '\0';
  EVP_CIPHER_CTX_reset(ctx);
  puVar11 = local_50;
  local_54 = 1;
  pcVar10 = "Test FAILED";
  if (((long)local_3c == local_48) && ((long)local_38 == plen)) {
    puVar7[-8] = 0xf4;
    puVar7[-7] = '\x15';
    puVar7[-6] = '\x10';
    puVar7[-5] = '\0';
    puVar7[-4] = '\0';
    puVar7[-3] = '\0';
    puVar7[-2] = '\0';
    puVar7[-1] = '\0';
    iVar5 = bcmp(puVar11,exp_ctext,plen);
    puVar11 = local_68;
    __n = local_88;
    if (iVar5 == 0) {
      builtin_memcpy(auStack_a0 + lVar1 + lVar2 + -8,"\t\x16\x10",4);
      puVar7[-4] = '\0';
      puVar7[-3] = '\0';
      puVar7[-2] = '\0';
      puVar7[-1] = '\0';
      iVar5 = bcmp(puVar11,exp_tag,__n);
      local_54 = (uint)(iVar5 != 0);
      pcVar10 = "Test passed";
      if (iVar5 != 0) {
        pcVar10 = "Test FAILED";
      }
    }
  }
  builtin_memcpy(auStack_a0 + lVar1 + lVar2 + -8,"3\x16\x10",4);
  puVar7[-4] = '\0';
  puVar7[-3] = '\0';
  puVar7[-2] = '\0';
  puVar7[-1] = '\0';
  puts(pcVar10);
  pcVar4 = local_70;
  pcVar10 = local_90;
  builtin_memcpy(auStack_a0 + lVar1 + lVar2 + -8,"L\x16\x10",4);
  puVar7[-4] = '\0';
  puVar7[-3] = '\0';
  puVar7[-2] = '\0';
  puVar7[-1] = '\0';
  printf("Decryption test %s [%s]: ",pcVar4,pcVar10);
  builtin_memcpy(auStack_a0 + lVar1 + lVar2 + -8,"T\x16\x10",4);
  puVar7[-4] = '\0';
  puVar7[-3] = '\0';
  puVar7[-2] = '\0';
  puVar7[-1] = '\0';
  EVP_CIPHER_CTX_reset(ctx);
  pEVar3 = local_78;
  builtin_memcpy(auStack_a0 + lVar1 + lVar2 + -8,"g\x16\x10",4);
  puVar7[-4] = '\0';
  puVar7[-3] = '\0';
  puVar7[-2] = '\0';
  puVar7[-1] = '\0';
  EVP_DecryptInit_ex(ctx,pEVar3,(ENGINE *)0x0,(uchar *)0x0,(uchar *)0x0);
  sVar9 = local_60;
  builtin_memcpy(auStack_a0 + lVar1 + lVar2 + -8,"z\x16\x10",4);
  puVar7[-4] = '\0';
  puVar7[-3] = '\0';
  puVar7[-2] = '\0';
  puVar7[-1] = '\0';
  EVP_CIPHER_CTX_ctrl(ctx,9,(int)sVar9,(void *)0x0);
  puVar11 = local_80;
  puVar7[-8] = 0x8e;
  puVar7[-7] = '\x16';
  puVar7[-6] = '\x10';
  puVar7[-5] = '\0';
  puVar7[-4] = '\0';
  puVar7[-3] = '\0';
  puVar7[-2] = '\0';
  puVar7[-1] = '\0';
  EVP_DecryptInit_ex(ctx,(EVP_CIPHER *)0x0,(ENGINE *)0x0,key,puVar11);
  puVar11 = local_50;
  puVar7[-8] = 0x9f;
  puVar7[-7] = '\x16';
  puVar7[-6] = '\x10';
  puVar7[-5] = '\0';
  puVar7[-4] = '\0';
  puVar7[-3] = '\0';
  puVar7[-2] = '\0';
  puVar7[-1] = '\0';
  memset(puVar11,0,plen);
  sVar9 = local_48;
  if (small == 0) {
    builtin_memcpy(auStack_a0 + lVar1 + lVar2 + -8,"3\x17\x10",4);
    puVar7[-4] = '\0';
    puVar7[-3] = '\0';
    puVar7[-2] = '\0';
    puVar7[-1] = '\0';
    EVP_DecryptUpdate(ctx,(uchar *)0x0,&local_3c,aad,(int)sVar9);
    builtin_memcpy(auStack_a0 + lVar1 + lVar2 + -8,"H\x17\x10",4);
    puVar7[-4] = '\0';
    puVar7[-3] = '\0';
    puVar7[-2] = '\0';
    puVar7[-1] = '\0';
    EVP_DecryptUpdate(ctx,puVar11,&local_38,exp_ctext,(int)plen);
  }
  else {
    local_38 = 0;
    local_3c = 0;
    if (local_48 != 0) {
      do {
        puVar7[-8] = 0xd2;
        puVar7[-7] = '\x16';
        puVar7[-6] = '\x10';
        puVar7[-5] = '\0';
        puVar7[-4] = '\0';
        puVar7[-3] = '\0';
        puVar7[-2] = '\0';
        puVar7[-1] = '\0';
        EVP_DecryptUpdate(ctx,(uchar *)0x0,&outlen1,aad,1);
        local_3c = local_3c + outlen1;
        aad = aad + 1;
        sVar9 = sVar9 - 1;
      } while (sVar9 != 0);
    }
    if (plen != 0) {
      puVar11 = local_50;
      sVar9 = plen;
      do {
        builtin_memcpy(auStack_a0 + lVar1 + lVar2 + -8,"\n\x17\x10",4);
        puVar7[-4] = '\0';
        puVar7[-3] = '\0';
        puVar7[-2] = '\0';
        puVar7[-1] = '\0';
        EVP_DecryptUpdate(ctx,puVar11,&outlen1,exp_ctext,1);
        local_38 = local_38 + outlen1;
        puVar11 = puVar11 + outlen1;
        exp_ctext = exp_ctext + 1;
        sVar9 = sVar9 - 1;
      } while (sVar9 != 0);
    }
  }
  sVar9 = local_60;
  builtin_memcpy(auStack_a0 + lVar1 + lVar2 + -8,"]\x17\x10",4);
  puVar7[-4] = '\0';
  puVar7[-3] = '\0';
  puVar7[-2] = '\0';
  puVar7[-1] = '\0';
  EVP_CIPHER_CTX_ctrl(ctx,0x11,(int)sVar9,exp_tag);
  puVar11 = local_50;
  builtin_memcpy(auStack_a0 + lVar1 + lVar2 + -8,"m\x17\x10",4);
  puVar7[-4] = '\0';
  puVar7[-3] = '\0';
  puVar7[-2] = '\0';
  puVar7[-1] = '\0';
  iVar5 = EVP_DecryptFinal_ex(ctx,puVar11,&outlen1);
  builtin_memcpy(auStack_a0 + lVar1 + lVar2 + -8,"x\x17\x10",4);
  puVar7[-4] = '\0';
  puVar7[-3] = '\0';
  puVar7[-2] = '\0';
  puVar7[-1] = '\0';
  EVP_CIPHER_CTX_reset(ctx);
  puVar7[-8] = 0x80;
  puVar7[-7] = '\x17';
  puVar7[-6] = '\x10';
  puVar7[-5] = '\0';
  puVar7[-4] = '\0';
  puVar7[-3] = '\0';
  puVar7[-2] = '\0';
  puVar7[-1] = '\0';
  EVP_CIPHER_CTX_free(ctx);
  puVar11 = local_50;
  uVar8 = 1;
  pcVar10 = "Test FAILED";
  if (((long)local_3c == local_48) && ((long)local_38 == plen)) {
    puVar7[-8] = 0xb0;
    puVar7[-7] = '\x17';
    puVar7[-6] = '\x10';
    puVar7[-5] = '\0';
    puVar7[-4] = '\0';
    puVar7[-3] = '\0';
    puVar7[-2] = '\0';
    puVar7[-1] = '\0';
    iVar6 = bcmp(puVar11,ptext,plen);
    if (iVar6 == 0) {
      uVar8 = (uint)(iVar5 != 1);
      pcVar10 = "Test passed";
      if (iVar5 != 1) {
        pcVar10 = "Test FAILED";
      }
    }
  }
  uVar8 = uVar8 | local_54;
  puVar7[-8] = 0xda;
  puVar7[-7] = '\x17';
  puVar7[-6] = '\x10';
  puVar7[-5] = '\0';
  puVar7[-4] = '\0';
  puVar7[-3] = '\0';
  puVar7[-2] = '\0';
  puVar7[-1] = '\0';
  puts(pcVar10);
  return uVar8;
}

Assistant:

static int test_block(const EVP_CIPHER *ciph, const char *name, const unsigned char *nonce, size_t nlen,
                      const unsigned char *aad, size_t alen, const unsigned char *ptext, size_t plen,
                      const unsigned char *exp_ctext, const unsigned char *exp_tag,
                      const unsigned char * key, int small)
{
    EVP_CIPHER_CTX *ctx = EVP_CIPHER_CTX_new();
    unsigned char *c = alloca(plen);
    int tag_len = nlen;
    unsigned char *t = alloca(tag_len);
    int outlen1, outlen2, tmplen;
    int ret = 0, rv, test, i;

    OPENSSL_assert(ctx);
    printf("Encryption test %s [%s]: ", name, small ? "small chunks" : "big chunks");

    // test encrypt
    EVP_CIPHER_CTX_init(ctx);
    EVP_EncryptInit_ex(ctx, ciph, NULL, NULL, NULL);                    // Set cipher type and mode
    EVP_CIPHER_CTX_ctrl(ctx, EVP_CTRL_AEAD_SET_IVLEN, nlen, NULL);      // Set IV length
    EVP_EncryptInit_ex(ctx, NULL, NULL, key, nonce);                    // Initialise key and IV
    memset(c, 0, plen);
    if (!small) {
        // test big chunks
        EVP_EncryptUpdate(ctx, NULL, &outlen1, aad, alen);              // Zero or more calls to specify any AAD
        EVP_EncryptUpdate(ctx, c, &outlen2, ptext, plen);               // Encrypt plaintext
    } else {
        // test small chunks
        outlen1 = outlen2 = 0;
        unsigned char *p;
        for (i = 0; i < alen; i++) {
            EVP_EncryptUpdate(ctx, NULL, &tmplen, aad + i, 1);
            outlen1 += tmplen;
        }
        for (i = 0, p = c; i < plen; i++) {
            EVP_EncryptUpdate(ctx, p, &tmplen, ptext + i, 1);
            p += tmplen;
            outlen2 += tmplen;
        }
    }
    EVP_EncryptFinal_ex(ctx, c, &tmplen);
    EVP_CIPHER_CTX_ctrl(ctx, EVP_CTRL_AEAD_GET_TAG, tag_len, t);
    EVP_CIPHER_CTX_cleanup(ctx);

    TEST_ASSERT(outlen1 != alen || outlen2 != plen ||
                memcmp(c, exp_ctext, plen) ||
                memcmp(t, exp_tag, tag_len));
    ret |= test;


    // test decrtypt
    printf("Decryption test %s [%s]: ", name, small ? "small chunks" : "big chunks");
    EVP_CIPHER_CTX_init(ctx);
    EVP_DecryptInit_ex(ctx, ciph, NULL, NULL, NULL);
    EVP_CIPHER_CTX_ctrl(ctx, EVP_CTRL_AEAD_SET_IVLEN, nlen, NULL);
    EVP_DecryptInit_ex(ctx, NULL, NULL, key, nonce);
    memset(c, 0, plen);
    if (!small) {
        // test big chunks
        EVP_DecryptUpdate(ctx, NULL, &outlen1, aad, alen);
        EVP_DecryptUpdate(ctx, c, &outlen2, exp_ctext, plen);
    } else {
        // test small chunks
        outlen1 = outlen2 = 0;
        unsigned char *p;
        for (i = 0; i < alen; i++) {
            EVP_DecryptUpdate(ctx, NULL, &tmplen, aad + i, 1);
            outlen1 += tmplen;
        }
        for (i = 0, p = c; i < plen; i++) {
            EVP_DecryptUpdate(ctx, p, &tmplen, exp_ctext + i, 1);
            p += tmplen;
            outlen2 += tmplen;
        }
    }
    EVP_CIPHER_CTX_ctrl(ctx, EVP_CTRL_AEAD_SET_TAG, tag_len, (void *)exp_tag);
    rv = EVP_DecryptFinal_ex(ctx, c, &tmplen);
    EVP_CIPHER_CTX_cleanup(ctx);
    EVP_CIPHER_CTX_free(ctx);

    TEST_ASSERT(outlen1 != alen || outlen2 != plen ||
                memcmp(c, ptext, plen) || rv != 1);
    ret |= test;

    return ret;
}